

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O2

int file_gets(BIO *bp,char *buf,int size)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  
  iVar3 = 0;
  if (size != 0) {
    pcVar1 = fgets(buf,size,(FILE *)bp->ptr);
    if (pcVar1 == (char *)0x0) {
      *buf = '\0';
      iVar3 = 0;
    }
    else {
      sVar2 = strlen(buf);
      iVar3 = (int)sVar2;
    }
  }
  return iVar3;
}

Assistant:

static int file_gets(BIO *bp, char *buf, int size) {
  if (size == 0) {
    return 0;
  }

  if (!fgets(buf, size, (FILE *)bp->ptr)) {
    buf[0] = 0;
    // TODO(davidben): This doesn't distinguish error and EOF. This should check
    // |ferror| as in |file_read|.
    return 0;
  }

  return (int)strlen(buf);
}